

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O2

int AF_AActor_Spawn(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret
                   ,int numret)

{
  bool bVar1;
  AActor *val;
  int iVar2;
  char *pcVar3;
  PClassActor *type;
  DVector3 local_48;
  
  if (numparam < 1) {
    pcVar3 = "(paramnum) < numparam";
    goto LAB_004323dd;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_004323cd:
    pcVar3 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
    goto LAB_004323dd;
  }
  type = (PClassActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (type == (PClassActor *)0x0) goto LAB_0043228e;
LAB_004322a2:
    bVar1 = PClass::IsAncestorOf(AActor::RegistrationInfo.MyClass,&type->super_PClass);
    if (!bVar1) {
      pcVar3 = "type == NULL || type->IsDescendantOf(RUNTIME_CLASS(AActor))";
LAB_004323dd:
      __assert_fail(pcVar3,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0x1246,
                    "int AF_AActor_Spawn(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
  }
  else {
    if (type != (PClassActor *)0x0) goto LAB_004323cd;
LAB_0043228e:
    NullParam("\"type\"");
    type = (PClassActor *)(param->field_0).field_1.a;
    if (type != (PClassActor *)0x0) goto LAB_004322a2;
    type = (PClassActor *)0x0;
  }
  if (numparam == 1) {
    param = defaultparam->Array;
    if (param[1].field_0.field_3.Type != '\x01') {
      pcVar3 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_0043246b:
      __assert_fail(pcVar3,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0x1247,
                    "int AF_AActor_Spawn(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    local_48.X = (double)param[1].field_0.field_1.a;
LAB_0043231d:
    if (param[2].field_0.field_3.Type != '\x01') {
      pcVar3 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_0043248a:
      __assert_fail(pcVar3,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0x1248,
                    "int AF_AActor_Spawn(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    local_48.Y = (double)param[2].field_0.field_1.a;
LAB_0043232e:
    if (param[3].field_0.field_3.Type != '\x01') {
      pcVar3 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_0043241b:
      __assert_fail(pcVar3,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0x1249,
                    "int AF_AActor_Spawn(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    local_48.Z = (double)param[3].field_0.field_1.a;
  }
  else {
    if (param[1].field_0.field_3.Type != '\x01') {
      pcVar3 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_0043246b;
    }
    local_48.X = (double)param[1].field_0.field_1.a;
    if ((uint)numparam < 3) {
      param = defaultparam->Array;
      goto LAB_0043231d;
    }
    if (param[2].field_0.field_3.Type != '\x01') {
      pcVar3 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_0043248a;
    }
    local_48.Y = (double)param[2].field_0.field_1.a;
    if (numparam == 3) {
      param = defaultparam->Array;
      goto LAB_0043232e;
    }
    if (param[3].field_0.field_3.Type != '\x01') {
      pcVar3 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_0043241b;
    }
    local_48.Z = (double)param[3].field_0.field_1.a;
    if (4 < (uint)numparam) {
      if (param[4].field_0.field_3.Type != '\0') {
        pcVar3 = "(param[paramnum]).Type == REGT_INT";
        goto LAB_004323fc;
      }
      goto LAB_0043234a;
    }
    param = defaultparam->Array;
  }
  if (param[4].field_0.field_3.Type != '\0') {
    pcVar3 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_004323fc:
    __assert_fail(pcVar3,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x124a,"int AF_AActor_Spawn(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
    ;
  }
LAB_0043234a:
  iVar2 = 0;
  val = AActor::StaticSpawn(type,&local_48,param[4].field_0.i,false);
  if (0 < numret) {
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0x124b,
                    "int AF_AActor_Spawn(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    iVar2 = 1;
    VMReturn::SetPointer(ret,val,1);
  }
  return iVar2;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, Spawn)
{
	PARAM_PROLOGUE;
	PARAM_CLASS_NOT_NULL(type, AActor);
	PARAM_FLOAT_DEF(x);
	PARAM_FLOAT_DEF(y);
	PARAM_FLOAT_DEF(z);
	PARAM_INT_DEF(flags);
	ACTION_RETURN_OBJECT(AActor::StaticSpawn(type, DVector3(x, y, z), replace_t(flags)));
}